

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ColorRGB c;
  ColorRGB c_00;
  ColorRGB c_01;
  ColorRGB c_02;
  ColorRGB c_03;
  World *pWVar1;
  Sphere *this;
  Parallelepiped *this_00;
  CornellBox *this_01;
  PointLight *pPVar2;
  Camera *this_02;
  ostream *this_03;
  Camera *cam;
  ColorRGB local_35c;
  int local_350 [3];
  tvec3<float> local_344;
  ColorRGB local_338;
  ColorRGB local_324;
  int local_318 [3];
  tvec3<float> local_30c;
  ColorRGB local_300;
  ColorRGB local_2ec;
  int local_2e0 [3];
  tvec3<float> local_2d4;
  ColorRGB local_2c8;
  ColorRGB local_2b4;
  int local_2a8 [3];
  tvec3<float> local_29c;
  int local_290 [3];
  tvec3<float> local_284;
  int local_278 [3];
  tvec3<float> local_26c;
  int local_260 [3];
  tvec3<float> local_254;
  int local_248 [3];
  tvec3<float> local_23c;
  int local_230 [3];
  tvec3<float> local_224;
  int local_218 [3];
  tvec3<float> local_20c;
  int local_200 [3];
  tvec3<float> local_1f4;
  tmat4x4<float> local_1e8;
  int local_1a8 [3];
  tvec3<float> local_19c;
  tmat4x4<float> local_190;
  tmat4x4<float> local_150;
  tmat4x4<float> local_110;
  undefined1 local_d0 [8];
  mat4 model;
  float local_80;
  ColorRGB local_7c;
  tmat4x4<float> local_70;
  CornellBox *local_30;
  SceneObject *so;
  World *local_18;
  World *world;
  
  world._4_4_ = 0;
  pWVar1 = (World *)operator_new(0x38);
  World::World(pWVar1);
  local_18 = pWVar1;
  this = (Sphere *)operator_new(0xa8);
  glm::translate<float>(&local_70,6.0,-7.0,-50.0);
  ColorRGB::ColorRGB(&local_7c,1.0,1.0,1.0);
  local_80 = 3.0;
  model.value[3].field_0._8_4_ = local_7c.r;
  model.value[3].field_0._12_4_ = local_7c.g;
  c_03.b = local_7c.b;
  c_03.r = local_7c.r;
  c_03.g = local_7c.g;
  Sphere::Sphere(this,&local_70,c_03,&local_80);
  local_30 = (CornellBox *)this;
  World::addSceneObject(local_18,(SceneObject *)this);
  glm::translate<float>(&local_150,-4.0,-10.0,-55.0);
  local_1a8[2] = 0;
  local_1a8[1] = 1;
  local_1a8[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_19c,local_1a8 + 2,local_1a8 + 1,local_1a8);
  glm::rotate<float>(&local_190,40.0,&local_19c);
  glm::detail::operator*(&local_110,&local_150,&local_190);
  glm::scale<float>(&local_1e8,10.0,12.0,8.0);
  glm::detail::operator*((tmat4x4<float> *)local_d0,&local_110,&local_1e8);
  this_00 = (Parallelepiped *)operator_new(0x120);
  local_200[2] = 0;
  local_200[1] = 0;
  local_200[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_1f4,local_200 + 2,local_200 + 1,local_200);
  local_218[2] = 1;
  local_218[1] = 0;
  local_218[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_20c,local_218 + 2,local_218 + 1,local_218);
  local_230[2] = 0;
  local_230[1] = 1;
  local_230[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_224,local_230 + 2,local_230 + 1,local_230);
  local_248[2] = 1;
  local_248[1] = 1;
  local_248[0] = 0;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_23c,local_248 + 2,local_248 + 1,local_248);
  local_260[2] = 0;
  local_260[1] = 0;
  local_260[0] = -1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_254,local_260 + 2,local_260 + 1,local_260);
  local_278[2] = 1;
  local_278[1] = 0;
  local_278[0] = -1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_26c,local_278 + 2,local_278 + 1,local_278);
  local_290[2] = 0;
  local_290[1] = 1;
  local_290[0] = -1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_284,local_290 + 2,local_290 + 1,local_290);
  local_2a8[2] = 1;
  local_2a8[1] = 1;
  local_2a8[0] = -1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_29c,local_2a8 + 2,local_2a8 + 1,local_2a8);
  ColorRGB::ColorRGB(&local_2b4,1.0,1.0,0.0);
  local_2c8.b = local_2b4.b;
  local_2c8.r = local_2b4.r;
  local_2c8.g = local_2b4.g;
  c_02.b = local_2b4.b;
  c_02.r = local_2b4.r;
  c_02.g = local_2b4.g;
  Parallelepiped::Parallelepiped
            (this_00,(mat4 *)local_d0,&local_1f4,&local_20c,&local_224,&local_23c,&local_254,
             &local_26c,&local_284,&local_29c,true,c_02);
  local_30 = (CornellBox *)this_00;
  World::addSceneObject(local_18,(SceneObject *)this_00);
  this_01 = (CornellBox *)operator_new(0x148);
  CornellBox::CornellBox(this_01);
  local_30 = this_01;
  World::addSceneObject(local_18,(SceneObject *)this_01);
  pWVar1 = local_18;
  pPVar2 = (PointLight *)operator_new(0x18);
  local_2e0[2] = 0;
  local_2e0[1] = 6;
  local_2e0[0] = -0x28;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_2d4,local_2e0 + 2,local_2e0 + 1,local_2e0);
  ColorRGB::ColorRGB(&local_2ec,0.0,0.0,0.5);
  local_300.b = local_2ec.b;
  local_300.r = local_2ec.r;
  local_300.g = local_2ec.g;
  c_01.b = local_2ec.b;
  c_01.r = local_2ec.r;
  c_01.g = local_2ec.g;
  PointLight::PointLight(pPVar2,&local_2d4,c_01);
  World::addPointLight(pWVar1,pPVar2);
  pWVar1 = local_18;
  pPVar2 = (PointLight *)operator_new(0x18);
  local_318[2] = 0xfffffffb;
  local_318[1] = 0xfffffffa;
  local_318[0] = -0x2c;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_30c,local_318 + 2,local_318 + 1,local_318);
  ColorRGB::ColorRGB(&local_324,0.5,0.0,0.0);
  local_338.b = local_324.b;
  local_338.r = local_324.r;
  local_338.g = local_324.g;
  c_00.b = local_324.b;
  c_00.r = local_324.r;
  c_00.g = local_324.g;
  PointLight::PointLight(pPVar2,&local_30c,c_00);
  World::addPointLight(pWVar1,pPVar2);
  pWVar1 = local_18;
  pPVar2 = (PointLight *)operator_new(0x18);
  local_350[2] = 4;
  local_350[1] = 0xfffffffa;
  local_350[0] = -0x28;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_344,local_350 + 2,local_350 + 1,local_350);
  ColorRGB::ColorRGB(&local_35c,0.0,0.5,0.0);
  c.b = local_35c.b;
  c.r = local_35c.r;
  c.g = local_35c.g;
  PointLight::PointLight(pPVar2,&local_344,c);
  World::addPointLight(pWVar1,pPVar2);
  this_02 = (Camera *)operator_new(0x38);
  Camera::Camera(this_02);
  Camera::raytraceToFile(this_02,local_18,"./test.ppm");
  this_03 = std::operator<<((ostream *)&std::cout,"Done");
  std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{    
    World *world = new World();
    SceneObject *so;
    
//     so = new Sphere(glm::translate<float>(4.0, 0.0, -45.0), ColorRGB(1.0, 1.0, 1.0), 1.0);
//     world->addSceneObject(so);
    
    //some nice spheres
    so = new Sphere(glm::translate<float>(6.0, -7.0, -50.0), ColorRGB(1.0, 1.0, 1.0), 3.0);
    world->addSceneObject(so);
    
    glm::mat4 model =
        glm::translate<float>(-4.0, -10.0, -55.0) *
        glm::rotate<float>(40, glm::vec3(0, 1, 0)) *
        glm::scale<float>(10, 12, 8);
    
    so = new Parallelepiped(
        model,
        glm::vec3(0, 0, 0),
        glm::vec3(1, 0, 0),
        glm::vec3(0, 1, 0),
        glm::vec3(1, 1, 0),
        glm::vec3(0, 0, -1),
        glm::vec3(1, 0, -1),
        glm::vec3(0, 1, -1),
        glm::vec3(1, 1, -1),
        true,
        ColorRGB(1.0, 1.0, 0.0));
    world->addSceneObject(so);
    
//     so = new Parallelepiped(
//         glm::translate<float>(3.0, 0.0, -45.0),
//         glm::vec3(0, 0, 0),
//         glm::vec3(1, 0, 0),
//         glm::vec3(0, 1, 0),
//         glm::vec3(1, 1, 0),
//         glm::vec3(0, 0, -1),
//         glm::vec3(1, 0, -1),
//         glm::vec3(0, 1, -1),
//         glm::vec3(1, 1, -1),
//         true,
//         ColorRGB(1.0, 1.0, 1.0));
//     world->addSceneObject(so);
    
    so = new CornellBox();
    world->addSceneObject(so);
    
        
    world->addPointLight(new PointLight(glm::vec3(0, 6, -40), ColorRGB(0, 0, 0.5)));
    world->addPointLight(new PointLight(glm::vec3(-5, -6, -44), ColorRGB(0.5, 0, 0)));
    world->addPointLight(new PointLight(glm::vec3(4, -6, -40), ColorRGB(0, 0.5, 0)));
    
    Camera *cam = new Camera();
        
    cam->raytraceToFile(world, "./test.ppm");

    std::cout << "Done" << std::endl;
    return 0;
}